

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * fmt::v6::internal::format_uint<1u,char,unsigned__int128>
                 (char *buffer,unsigned___int128 value,int num_digits,bool upper)

{
  ulong uVar1;
  int in_ECX;
  byte *pbVar2;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  pbVar2 = (byte *)(buffer + in_ECX);
  uVar3 = CONCAT44(in_register_00000034,num_digits);
  uVar4 = CONCAT71(in_register_00000011,upper);
  do {
    pbVar2 = pbVar2 + -1;
    *pbVar2 = (byte)uVar3 & 1 | 0x30;
    bVar5 = 1 < uVar3;
    bVar6 = uVar4 != 0;
    uVar1 = -uVar4;
    uVar3 = uVar4 << 0x3f | uVar3 >> 1;
    uVar4 = uVar4 >> 1;
  } while (bVar6 || uVar1 < bVar5);
  return buffer + in_ECX;
}

Assistant:

inline Char* format_uint(Char* buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : data::hex_digits;
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}